

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O0

bool Fossilize::ZipDatabase::string_is_hex(char *str)

{
  int iVar1;
  byte *local_18;
  char *str_local;
  
  local_18 = (byte *)str;
  while( true ) {
    if (*local_18 == 0) {
      return true;
    }
    iVar1 = isxdigit((uint)*local_18);
    if (iVar1 == 0) break;
    local_18 = local_18 + 1;
  }
  return false;
}

Assistant:

static bool string_is_hex(const char *str)
	{
		while (*str)
		{
			if (!isxdigit(uint8_t(*str)))
				return false;
			str++;
		}
		return true;
	}